

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_process_file_name.cpp
# Opt level: O1

void __thiscall
ProcessFileName_BufferContentsWithInitialSize_Test::TestBody
          (ProcessFileName_BufferContentsWithInitialSize_Test *this)

{
  undefined1 auVar1 [8];
  void *pvVar2;
  void *__dest;
  ptrdiff_t _Num;
  size_t __n;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar3;
  ulong uVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  size_t length;
  small_vector<char,_128UL> buffer;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  pointer local_128;
  AssertHelper local_120;
  undefined4 local_118;
  char local_114 [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  allocator_type local_f9;
  void *local_f8;
  void *local_f0;
  long local_e8;
  size_t local_e0;
  small_vector<char,_128UL> local_d8;
  
  local_d8.elements_ = 0x80;
  memset(&local_d8.small_buffer_,0,0xa0);
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage +
       -(long)local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_120.data_._0_4_ = 0x80;
  if (local_110._M_head_impl <
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x81) {
    local_110._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x80;
  }
  local_d8.buffer_ = local_d8.small_buffer_._M_elems;
  testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
            ((internal *)local_138,"128U","buffer.capacity ()",(uint *)&local_120,
             (unsigned_long *)&local_110);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0015d624;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_130;
    local_108 = pbStack_130;
  }
  else {
    if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_130,pbStack_130);
    }
    local_e0 = pstore::
               process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),pstore::small_vector<char,128ul>>
                         (anon_unknown.dwarf_16ca6a::ProcessFileName::get_process_path,&local_d8);
    local_110._M_head_impl._0_4_ = 0xc;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_138,"length","12U",&local_e0,(uint *)&local_110);
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (pbStack_130->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
                 ,0x47,message);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_110._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._M_head_impl + 8))();
      }
    }
    if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_130,pbStack_130);
    }
    pstore::small_vector<char,_128UL>::resize(&local_d8,0xc);
    local_120.data_ = (AssertHelperData *)0x20737365636f7270;
    local_118 = 0x68746170;
    std::vector<char,std::allocator<char>>::vector<char_const*,void>
              ((vector<char,std::allocator<char>> *)&local_f8,(char *)&local_120,local_114,&local_f9
              );
    uVar4 = (long)local_f0 - (long)local_f8;
    if (uVar4 == 0) {
      __dest = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = operator_new(uVar4);
    }
    pvVar2 = local_f8;
    __n = (long)local_f0 - (long)local_f8;
    if (__n != 0) {
      memmove(__dest,local_f8,__n);
    }
    local_138 = (undefined1  [8])0x0;
    pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_128 = (pointer)0x0;
    std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
              ((_Vector_base<char,_std::allocator<char>_> *)local_138,__n);
    auVar1 = local_138;
    if (local_f0 != pvVar2) {
      memmove((void *)local_138,__dest,__n);
    }
    pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)auVar1 + __n);
    if (__dest != (void *)0x0) {
      operator_delete(__dest,uVar4);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<char>>::operator()
              (&local_110,local_138,(small_vector<char,_128UL> *)0x1a55ee);
    if (local_138 != (undefined1  [8])0x0) {
      operator_delete((void *)local_138,(long)local_128 - (long)local_138);
    }
    if (local_f8 != (void *)0x0) {
      operator_delete(local_f8,local_e8 - (long)local_f8);
    }
    if ((char)local_110._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_138);
      if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_108->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp"
                 ,0x4b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
    }
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0015d624;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_108;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_108);
LAB_0015d624:
  if (local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.big_buffer_.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (ProcessFileName, BufferContentsWithInitialSize) {
    pstore::small_vector<char, 128> buffer (std::size_t{128});
    ASSERT_GE (128U, buffer.capacity ());
    std::size_t length = pstore::process_file_name (&get_process_path, buffer);
    EXPECT_EQ (length, 12U);
    buffer.resize (12U); // lose any additional buffer bytes.

    EXPECT_THAT (buffer, ::testing::ElementsAreArray (
                             {'p', 'r', 'o', 'c', 'e', 's', 's', ' ', 'p', 'a', 't', 'h'}));
}